

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

int __thiscall
leveldb::InternalKeyComparator::Compare(InternalKeyComparator *this,Slice *akey,Slice *bkey)

{
  long *plVar1;
  char *pcVar2;
  size_t sVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  Slice *in_RDX;
  Slice *in_RSI;
  long in_RDI;
  uint64_t bnum;
  uint64_t anum;
  int r;
  Slice *in_stack_ffffffffffffffa0;
  Slice local_40;
  Slice local_30;
  int local_1c;
  Slice *local_18;
  Slice *local_10;
  
  plVar1 = *(long **)(in_RDI + 8);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30 = ExtractUserKey(in_stack_ffffffffffffffa0);
  local_40 = ExtractUserKey(in_stack_ffffffffffffffa0);
  local_1c = (**(code **)(*plVar1 + 0x10))(plVar1,&local_30,&local_40);
  if (local_1c == 0) {
    pcVar2 = Slice::data(local_10);
    sVar3 = Slice::size(local_10);
    uVar4 = DecodeFixed64(pcVar2 + (sVar3 - 8));
    pcVar2 = Slice::data(local_18);
    sVar3 = Slice::size(local_18);
    uVar5 = DecodeFixed64(pcVar2 + (sVar3 - 8));
    if (uVar5 < uVar4) {
      local_1c = -1;
    }
    else if (uVar4 < uVar5) {
      local_1c = 1;
    }
  }
  return local_1c;
}

Assistant:

int InternalKeyComparator::Compare(const Slice& akey, const Slice& bkey) const {
  // Order by:
  //    increasing user key (according to user-supplied comparator)
  //    decreasing sequence number
  //    decreasing type (though sequence# should be enough to disambiguate)
  int r = user_comparator_->Compare(ExtractUserKey(akey), ExtractUserKey(bkey));
  if (r == 0) {
    const uint64_t anum = DecodeFixed64(akey.data() + akey.size() - 8);
    const uint64_t bnum = DecodeFixed64(bkey.data() + bkey.size() - 8);
    if (anum > bnum) {
      r = -1;
    } else if (anum < bnum) {
      r = +1;
    }
  }
  return r;
}